

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

char * __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::TryAlloc
          (HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_> *this,
          Recycler *recycler,TBlockAllocatorType *allocator,size_t sizeCat,ObjectInfoBits attributes
          )

{
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this_00;
  code *pcVar1;
  bool bVar2;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *pSVar3;
  undefined8 *in_FS_OFFSET;
  char *memBlock;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *heapBlock;
  AutoFilterExceptionRegion local_38;
  ObjectInfoBits local_32;
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  ObjectInfoBits attributes_local;
  size_t sizeCat_local;
  TBlockAllocatorType *allocator_local;
  Recycler *recycler_local;
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_> *this_local;
  
  local_32 = attributes;
  ___autoFilterExceptionRegion = sizeCat;
  AutoFilterExceptionRegion::AutoFilterExceptionRegion(&local_38,ExceptionType_All);
  if ((local_32 & InternalObjectInfoBitMask) != local_32) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x1e1,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  ClearAllocator(allocator);
  this_00 = this->nextAllocableBlockHead;
  if (this_00 == (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    if (this->explicitFreeList == (FreeObject *)0x0) {
      this_local = (HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
                    *)0x0;
      goto LAB_002c6f59;
    }
    SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
    SetExplicitFreeList(allocator,this->explicitFreeList);
    this->lastExplicitFreeListAllocator = allocator;
    this->explicitFreeList = (FreeObject *)0x0;
  }
  else {
    bVar2 = IsAllocationStopped(this);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x21d,"(!this->IsAllocationStopped())","!this->IsAllocationStopped()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    pSVar3 = SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock(this_00);
    this->nextAllocableBlockHead = pSVar3;
    SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
    Set(allocator,this_00);
  }
  this_local = (HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_> *)
               SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
               ::SlowAlloc<false>(allocator,recycler,___autoFilterExceptionRegion,local_32);
  if (this_local ==
      (HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x238,"(memBlock != nullptr)","memBlock != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
LAB_002c6f59:
  AutoFilterExceptionRegion::~AutoFilterExceptionRegion(&local_38);
  return (char *)this_local;
}

Assistant:

char *
HeapBucketT<TBlockType>::TryAlloc(Recycler * recycler, TBlockAllocatorType * allocator, size_t sizeCat, ObjectInfoBits attributes)
{
    AUTO_NO_EXCEPTION_REGION;

    Assert((attributes & InternalObjectInfoBitMask) == attributes);

    ClearAllocator(allocator);

    TBlockType * heapBlock = this->nextAllocableBlockHead;
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP 
#if SUPPORT_WIN32_SLIST
    bool heapBlockFromAllocableHeapBlockList = false;
    DebugOnly(bool heapBlockInPendingSweepPrepList = false);

    if (heapBlock == nullptr && this->allocationsStartedDuringConcurrentSweep)
    {
#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
        // This lock is needed only in the debug mode while we verify block counts. Not needed otherwise, as this list is never accessed concurrently.
        // Items are added to it by the allocator when allocations are allowed during concurrent sweep. The list is drained during the next sweep while
        // allocation are stopped.
        debugSweepableHeapBlockListLock.Enter();
#endif
        heapBlock = PopHeapBlockFromSList(this->allocableHeapBlockListHead);
        if (heapBlock != nullptr)
        {
            Assert(!this->IsAnyFinalizableBucket());
            DebugOnly(this->AssertCheckHeapBlockNotInAnyList(heapBlock));
#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
            heapBlock->wasAllocatedFromDuringSweep = true;
#endif
#if DBG || defined(RECYCLER_TRACE)
            if (heapBlock->isPendingConcurrentSweepPrep)
            {
                AssertMsg(heapBlock->objectsAllocatedDuringConcurrentSweepCount == 0, "We just picked up this block for allocations during concurrent sweep, we haven't allocated from it yet.");

#ifdef RECYCLER_TRACE
                recycler->PrintBlockStatus(this, heapBlock, _u("[**31**] pending Pass1 prep, picked up for allocations during concurrent sweep."));
#endif
                DebugOnly(heapBlockInPendingSweepPrepList = true);
            }
            else
            {
                // Put the block in the sweepable heap block list so we don't lose track of it. The block will eventually be moved to the
                // heapBlockList or fullBlockList as appropriate during the next sweep.
                AssertMsg(!HeapBlockList::Contains(heapBlock, sweepableHeapBlockList), "The heap block already exists in this list.");

#ifdef RECYCLER_TRACE
                recycler->PrintBlockStatus(this, heapBlock, _u("[**32**] picked up for allocations during concurrent sweep."));
#endif
            }
#endif
            heapBlock->SetNextBlock(sweepableHeapBlockList);
            sweepableHeapBlockList = heapBlock;
            heapBlockFromAllocableHeapBlockList = true;
        }
#if DBG|| defined(RECYCLER_SLOW_CHECK_ENABLED)
        debugSweepableHeapBlockListLock.Leave();
#endif
    }
#endif
#endif

   if (heapBlock != nullptr)
   {
        Assert(!this->IsAllocationStopped());

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
        // When allocations are allowed during concurrent sweep we set nextAllocableBlockHead to NULL as the allocator will pick heap blocks from the
        // interlocked SLIST. During that time, the heap block at the top of the SLIST is always the nextAllocableBlockHead.
        // If the heapBlock was just picked from the SLIST and nextAllocableBlockHead is not NULL then we just resumed normal allocations on the background thread
        // while finishing the concurrent sweep, and the nextAllocableBlockHead is already set properly.
        if (this->nextAllocableBlockHead != nullptr && !heapBlockFromAllocableHeapBlockList)
#endif
        {
            this->nextAllocableBlockHead = heapBlock->GetNextBlock();
        }

        allocator->Set(heapBlock);
    }
    else if (this->explicitFreeList != nullptr)
    {
        allocator->SetExplicitFreeList(this->explicitFreeList);
        this->lastExplicitFreeListAllocator = allocator;
        this->explicitFreeList = nullptr;
    }
    else
    {
        return nullptr;
    }
    // We just found a block we can allocate on
    char * memBlock = allocator->template SlowAlloc<false /* disallow fault injection */>(recycler, sizeCat, attributes);
    Assert(memBlock != nullptr);
    return memBlock;
}